

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_access.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
::insert_entry(Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
               *this,ID_index rowIndex,Matrix_entry *entry)

{
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
  *this_00;
  Matrix_entry *entry_local;
  Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
  *pRStack_10;
  ID_index rowIndex_local;
  Row_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
  *this_local;
  
  if (this->rows_ != (Row_container *)0x0) {
    entry_local._4_4_ = rowIndex;
    pRStack_10 = this;
    this_00 = &std::
               map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
               ::operator[](this->rows_,(key_type *)((long)&entry_local + 4))->super_type;
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
    ::push_back(this_00,entry);
  }
  return;
}

Assistant:

inline void Row_access<Master_matrix>::insert_entry(ID_index rowIndex, Matrix_entry* entry) 
{
  if (rows_ == nullptr) return;

  if constexpr (!Master_matrix::Option_list::has_removable_rows) {
    if (rows_->size() < rowIndex + 1) rows_->resize(rowIndex + 1);
  }

  // if has_removable_rows should op[] create non existing entry? If not, use try_emplace()
  if constexpr (Master_matrix::Option_list::has_intrusive_rows) {
    rows_->operator[](rowIndex).push_back(*entry);
  } else {
    rows_->operator[](rowIndex).insert(*entry);
  }
}